

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O1

void __thiscall ipx::Iterate::Postprocess(Iterate *this)

{
  double **ppdVar1;
  int iVar2;
  int iVar3;
  StateDetail SVar4;
  Model *pMVar5;
  pointer pSVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  double *pdVar13;
  pointer piVar14;
  uint uVar15;
  double *pdVar16;
  double **ppdVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  pMVar5 = this->model_;
  uVar15 = pMVar5->num_cols_ + pMVar5->num_rows_;
  if (uVar15 != 0 && SCARRY4(pMVar5->num_cols_,pMVar5->num_rows_) == (int)uVar15 < 0) {
    pSVar6 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->x_)._M_data;
    pdVar8 = (this->xl_)._M_data;
    pdVar9 = (this->xu_)._M_data;
    pdVar10 = (this->y_)._M_data;
    pdVar11 = (this->zl_)._M_data;
    pdVar12 = (this->zu_)._M_data;
    uVar19 = 0;
    do {
      if (pSVar6[uVar19] == FIXED) {
        pdVar13 = (pMVar5->lb_)._M_data;
        pdVar8[uVar19] = pdVar7[uVar19] - pdVar13[uVar19];
        pdVar16 = (pMVar5->ub_)._M_data;
        pdVar9[uVar19] = pdVar16[uVar19] - pdVar7[uVar19];
        dVar20 = pdVar13[uVar19];
        pdVar16 = pdVar16 + uVar19;
        if ((dVar20 == *pdVar16) && (!NAN(dVar20) && !NAN(*pdVar16))) {
          piVar14 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar2 = piVar14[uVar19];
          lVar18 = (long)iVar2;
          iVar3 = piVar14[uVar19 + 1];
          dVar20 = 0.0;
          if (iVar2 < iVar3) {
            do {
              dVar20 = dVar20 + pdVar10[(pMVar5->AI_).rowidx_.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start[lVar18]] *
                                (pMVar5->AI_).values_.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar18];
              lVar18 = lVar18 + 1;
            } while (iVar3 != lVar18);
          }
          dVar20 = (pMVar5->c_)._M_data[uVar19] - dVar20;
          dVar21 = -dVar20;
          pdVar16 = pdVar11;
          if (dVar20 < dVar21) {
            pdVar16 = pdVar12;
          }
          pdVar16[uVar19] =
               (double)(~-(ulong)(dVar20 < dVar21) & (ulong)dVar20 |
                       (ulong)dVar21 & -(ulong)(dVar20 < dVar21));
        }
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  if (0 < (int)uVar15) {
    pSVar6 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->y_)._M_data;
    pdVar8 = (this->zl_)._M_data;
    pdVar9 = (this->zu_)._M_data;
    pdVar10 = (this->x_)._M_data;
    pdVar11 = (this->xl_)._M_data;
    ppdVar1 = &(pMVar5->lb_)._M_data;
    pdVar12 = (this->xu_)._M_data;
    uVar19 = 0;
    do {
      if (pSVar6[uVar19] - IMPLIED_LB < 3) {
        piVar14 = (pMVar5->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar2 = piVar14[uVar19];
        lVar18 = (long)iVar2;
        iVar3 = piVar14[uVar19 + 1];
        dVar20 = 0.0;
        if (iVar2 < iVar3) {
          do {
            dVar20 = dVar20 + pdVar7[(pMVar5->AI_).rowidx_.
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar18]] *
                              (pMVar5->AI_).values_.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar18];
            lVar18 = lVar18 + 1;
          } while (iVar3 != lVar18);
        }
        dVar20 = (pMVar5->c_)._M_data[uVar19] - dVar20;
        SVar4 = pSVar6[uVar19];
        ppdVar17 = ppdVar1;
        if (SVar4 == IMPLIED_LB) {
LAB_003a5092:
          pdVar8[uVar19] = dVar20;
          dVar20 = 0.0;
LAB_003a50b4:
          pdVar9[uVar19] = dVar20;
          pdVar10[uVar19] = (*ppdVar17)[uVar19];
        }
        else {
          if (SVar4 == IMPLIED_UB) {
            pdVar8[uVar19] = 0.0;
            dVar20 = -dVar20;
            ppdVar17 = &(pMVar5->ub_)._M_data;
            goto LAB_003a50b4;
          }
          if (SVar4 == IMPLIED_EQ) {
            if (0.0 <= dVar20) goto LAB_003a5092;
            pdVar8[uVar19] = 0.0;
            dVar20 = -dVar20;
            goto LAB_003a50b4;
          }
        }
        pdVar11[uVar19] = pdVar10[uVar19] - (pMVar5->lb_)._M_data[uVar19];
        pdVar12[uVar19] = (pMVar5->ub_)._M_data[uVar19] - pdVar10[uVar19];
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar15);
  }
  this->evaluated_ = false;
  this->postprocessed_ = true;
  return;
}

Assistant:

void Iterate::Postprocess() {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& c = model_.c();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    // For fixed variables compute xl[j] and xu[j] from x[j]. If the lower and
    // upper bound are equal, set zl[j] or zu[j] such that the variable is dual
    // feasible. Otherwise leave them zero.
    for (Int j = 0; j < n+m; j++) {
        if (StateOf(j) == State::fixed) {
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
            assert(zl_[j] == 0.0);
            assert(zu_[j] == 0.0);
            if (lb[j] == ub[j]) {
                double z = c[j] - DotColumn(AI, j, y_);
                if (z >= 0.0)
                    zl_[j] = z;
                else
                    zu_[j] = -z;
            }
        }
    }
    // For implied variables set x[j] to the bound at which it was implied and
    // compute zl[j] or zu[j]. If the variable was implied at both bounds,
    // choose between zl and zu depending on sign.
    for (Int j = 0; j < n+m; j++) {
        if (is_implied(j)) {
            double z = c[j] - DotColumn(AI, j, y_);
            switch (variable_state_[j]) {
            case StateDetail::IMPLIED_EQ:
                assert(lb[j] == ub[j]);
                if (z >= 0.0) {
                    zl_[j] = z;
                    zu_[j] = 0.0;
                } else {
                    zl_[j] = 0.0;
                    zu_[j] = -z;
                }
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_LB:
                zl_[j] = z;
                zu_[j] = 0.0;
                x_[j] = lb[j];
                break;
            case StateDetail::IMPLIED_UB:
                zl_[j] = 0.0;
                zu_[j] = -z;
                x_[j] = ub[j];
                break;
            default:
                assert(0);
            }
            xl_[j] = x_[j] - lb[j];
            xu_[j] = ub[j] - x_[j];
        }
    }
    postprocessed_ = true;
    evaluated_ = false;
}